

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializable.cpp
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* blc::tools::serializable::cut
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *str,char cut)

{
  int iVar1;
  undefined7 in_register_00000011;
  string after;
  string before;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [40];
  
  iVar1 = std::__cxx11::string::find((char)str,CONCAT71(in_register_00000011,cut) & 0xffffffff);
  std::__cxx11::string::substr((ulong)&local_68,(ulong)str);
  std::__cxx11::string::substr((ulong)&bStack_88,(ulong)str);
  if (iVar1 == -1) {
    local_48._0_8_ = (long)"\n" + 1;
    std::__cxx11::string::string((string *)(local_48 + 8),(string *)str);
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string,char_const*>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  else {
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
               &local_68,&bStack_88);
  }
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, std::string> blc::tools::serializable::cut(const std::string &str, char cut) {
	int 		i = str.find(cut);
	std::string	before = str.substr(0, i);
	std::string	after = str.substr(i + 1, str.size());

	if (i == -1)
		return (std::make_tuple(str, ""));
	return (std::make_tuple(before, after));
}